

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerator.cpp
# Opt level: O2

Event * __thiscall SignalGenerator::update(SignalGenerator *this,double n_dt)

{
  SignalGenerator_param *pSVar1;
  ValueEvent *this_00;
  double dVar2;
  double dVar3;
  result_type_conflict rVar4;
  double dVar5;
  
  pSVar1 = this->param;
  dVar3 = pSVar1->f1;
  dVar5 = 0.0;
  if (0.0 < dVar3) {
    dVar5 = Clock::getCurrentTime(this->clock);
    dVar5 = sin(dVar5 * dVar3 * 6.2831853071794);
    dVar5 = dVar5 + 0.0;
    pSVar1 = this->param;
  }
  dVar3 = pSVar1->f2;
  if (0.0 < dVar3) {
    dVar2 = Clock::getCurrentTime(this->clock);
    dVar3 = sin(dVar2 * dVar3 * 6.2831853071794);
    dVar5 = dVar5 + dVar3;
    pSVar1 = this->param;
  }
  dVar3 = pSVar1->f3;
  if (0.0 < dVar3) {
    dVar2 = Clock::getCurrentTime(this->clock);
    dVar3 = sin(dVar2 * dVar3 * 6.2831853071794);
    dVar5 = dVar5 + dVar3;
    pSVar1 = this->param;
  }
  dVar3 = pSVar1->f4;
  if (0.0 < dVar3) {
    dVar2 = Clock::getCurrentTime(this->clock);
    dVar3 = sin(dVar2 * dVar3 * 6.2831853071794);
    dVar5 = dVar5 + dVar3;
    pSVar1 = this->param;
  }
  dVar3 = pSVar1->f5;
  if (0.0 < dVar3) {
    dVar2 = Clock::getCurrentTime(this->clock);
    dVar3 = sin(dVar2 * dVar3 * 6.2831853071794);
    dVar5 = dVar5 + dVar3;
    pSVar1 = this->param;
  }
  dVar3 = pSVar1->f6;
  if (0.0 < dVar3) {
    dVar2 = Clock::getCurrentTime(this->clock);
    dVar3 = sin(dVar2 * dVar3 * 6.2831853071794);
    dVar5 = dVar5 + dVar3;
    pSVar1 = this->param;
  }
  dVar3 = pSVar1->f7;
  if (0.0 < dVar3) {
    dVar2 = Clock::getCurrentTime(this->clock);
    dVar3 = sin(dVar2 * dVar3 * 6.2831853071794);
    dVar5 = dVar5 + dVar3;
    pSVar1 = this->param;
  }
  dVar3 = dVar5 * pSVar1->scale + pSVar1->offset;
  if (0.0 < pSVar1->noiseStd) {
    rVar4 = std::normal_distribution<double>::operator()(&this->distribution,&this->generator);
    dVar3 = dVar3 + rVar4;
  }
  Logging::logValue((this->super_Neuron).logger,999,0,3,dVar3);
  this_00 = (ValueEvent *)operator_new(0x20);
  ValueEvent::ValueEvent(this_00,dVar3);
  return &this_00->super_Event;
}

Assistant:

Event* SignalGenerator::update(double n_dt) {
    double signalValue = 0;
    if(param->f1 > 0)
        signalValue += sin(2*3.1415926535897*param->f1*clock->getCurrentTime());
    if(param->f2 > 0)
        signalValue += sin(2*3.1415926535897*param->f2*clock->getCurrentTime());
    if(param->f3 > 0)
        signalValue += sin(2*3.1415926535897*param->f3*clock->getCurrentTime());
    if(param->f4 > 0)
        signalValue += sin(2*3.1415926535897*param->f4*clock->getCurrentTime());
    if(param->f5 > 0)
        signalValue += sin(2*3.1415926535897*param->f5*clock->getCurrentTime());
    if(param->f6 > 0)
        signalValue += sin(2*3.1415926535897*param->f6*clock->getCurrentTime());
    if(param->f7 > 0)
        signalValue += sin(2*3.1415926535897*param->f7*clock->getCurrentTime());
    signalValue *= param->scale;
    signalValue += param->offset;
    if(param->noiseStd > 0) {
        signalValue += distribution(generator);
    }  
    logger->logValue(999, 0, EventType::Value, signalValue);
    return new ValueEvent(signalValue);
}